

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gridded_Data_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Gridded_Data_PDU::Gridded_Data_PDU(Gridded_Data_PDU *this,Header *H,KDataStream *stream)

{
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Gridded_Data_PDU_00216168;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EnvProcID);
  DATA_TYPE::EnvironmentType::EnvironmentType(&this->m_EnvType);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vGridData).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridData>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpGridAxisDesc).
  super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GridAxisRegular>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Gridded_Data_PDU::Gridded_Data_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    Header( H )
{
    Decode( stream, true );
}